

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IGeneratorsForTest * __thiscall Catch::Context::getGeneratorsForCurrentTest(Context *this)

{
  int iVar1;
  undefined4 extraout_var;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [8];
  string testName;
  IGeneratorsForTest *local_18;
  IGeneratorsForTest *generators;
  Context *this_local;
  
  generators = (IGeneratorsForTest *)this;
  local_18 = findGeneratorsForCurrentTest(this);
  if (local_18 == (IGeneratorsForTest *)0x0) {
    iVar1 = (*(this->super_IMutableContext).super_IContext._vptr_IContext[2])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x40))(local_38);
    local_18 = createGeneratorsForTest();
    std::make_pair<std::__cxx11::string&,Catch::IGeneratorsForTest*&>(&local_70,local_38,&local_18);
    std::
    map<std::__cxx11::string,Catch::IGeneratorsForTest*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>>
    ::insert<std::pair<std::__cxx11::string,Catch::IGeneratorsForTest*>>
              ((map<std::__cxx11::string,Catch::IGeneratorsForTest*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>>
                *)&this->m_generatorsByTestName,&local_70);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>
    ::~pair(&local_70);
    std::__cxx11::string::~string((string *)local_38);
  }
  return local_18;
}

Assistant:

IGeneratorsForTest& getGeneratorsForCurrentTest() {
			IGeneratorsForTest* generators = findGeneratorsForCurrentTest();
			if (!generators) {
				std::string testName = getResultCapture()->getCurrentTestName();
				generators = createGeneratorsForTest();
				m_generatorsByTestName.insert(std::make_pair(testName, generators));
			}
			return *generators;
		}